

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
geometrycentral::
applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *sourceData,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *permNewToOld)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *retVal;
  allocator_type *in_stack_ffffffffffffffa0;
  size_type sVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  undefined8 local_38;
  
  this = in_RDI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2453c3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this,(size_type)in_RDI,in_stack_ffffffffffffffa0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2453e3);
  local_38 = 0;
  while (sVar5 = local_38,
        sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX),
        sVar5 < sVar2) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDX,local_38)
    ;
    if (*pvVar3 != 0xffffffffffffffff) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDX,local_38);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RSI,*pvVar3);
      vVar1 = *pvVar3;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this,local_38)
      ;
      *pvVar4 = vVar1;
    }
    local_38 = local_38 + 1;
  }
  return in_RDI;
}

Assistant:

std::vector<T, A1> applyPermutation(const std::vector<T, A1>& sourceData, const std::vector<size_t, A2>& permNewToOld) {
  std::vector<T, A1> retVal(permNewToOld.size());
  for (size_t i = 0; i < permNewToOld.size(); i++) {
    if (permNewToOld[i] != INVALID_IND) {
      retVal[i] = sourceData[permNewToOld[i]];
    }
  }
  return retVal;
}